

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O0

void * isotree_deserialize_from_raw(char *serialized_model,int nthreads)

{
  bool bVar1;
  ostream *this;
  runtime_error *prVar2;
  size_type sVar3;
  void *__s;
  pointer pIVar4;
  int in_ESI;
  long in_RDI;
  exception *e;
  unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_> out;
  bool build_imputer;
  size_t ndim;
  size_t ntrees;
  unique_ptr<char[],_std::default_delete<char[]>_> buffer_metadata;
  TreesIndexer indexer;
  Imputer imputer;
  ExtIsoForest model_ext;
  IsoForest model;
  size_t size_metadata;
  bool has_metadata;
  bool has_Indexer;
  bool has_Imputer;
  bool has_ExtIsoForest;
  bool has_IsoForest;
  bool has_combined_objects;
  bool is_compatible;
  bool is_isotree_model;
  pointer __p;
  IsolationForest *this_00;
  Imputer *imputer_00;
  IsolationForest *this_01;
  IsoForest *in_stack_fffffffffffffdf8;
  bool *in_stack_fffffffffffffe00;
  bool *in_stack_fffffffffffffe08;
  bool *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  bool *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  bool *in_stack_fffffffffffffe40;
  bool *in_stack_fffffffffffffe48;
  bool *in_stack_fffffffffffffe50;
  size_t *in_stack_fffffffffffffe58;
  bool local_171;
  size_t local_170;
  size_type local_168;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> local_150;
  undefined1 local_138 [40];
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  avStack_110 [3];
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  local_c8 [3];
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  local_80 [3];
  undefined1 local_28 [13];
  undefined1 local_1b [2];
  undefined1 local_19;
  undefined1 local_18;
  byte local_17;
  byte local_16;
  byte local_15;
  int local_14;
  pointer local_8;
  
  if (in_RDI == 0) {
    this = std::operator<<((ostream *)&std::cerr,
                           "Passed NULL \'serialized_model\' to \'isotree_deserialize_from_raw\'.");
    std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
    local_8 = (pointer)0x0;
  }
  else {
    local_15 = 0;
    local_16 = 0;
    local_17 = 0;
    local_18 = 0;
    local_19 = 0;
    local_1b[1] = 0;
    local_1b[0] = 0;
    local_28[0xc] = 0;
    local_28._0_8_ = 0;
    this_01 = (IsolationForest *)local_28;
    imputer_00 = (Imputer *)(local_28 + 0xc);
    this_00 = (IsolationForest *)local_1b;
    __p = (pointer)(local_1b + 1);
    local_14 = in_ESI;
    inspect_serialized_object
              (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
               (bool *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
               in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
               in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe58);
    if ((((local_15 & 1) != 0) && ((local_16 & 1) != 0)) && ((local_17 & 1) == 0)) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Serialized model is not compatible.\n");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    memset(local_80,0,0x48);
    IsoForest::IsoForest((IsoForest *)0x6377a9);
    memset(local_c8,0,0x48);
    ExtIsoForest::ExtIsoForest((ExtIsoForest *)0x6377ca);
    memset(local_138,0,0x70);
    Imputer::Imputer((Imputer *)this_00);
    memset(&local_150,0,0x18);
    TreesIndexer::TreesIndexer((TreesIndexer *)0x63780c);
    std::unique_ptr<char[],std::default_delete<char[]>>::
    unique_ptr<std::default_delete<char[]>,void>
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)this_00);
    if (local_28._0_8_ != 0) {
      operator_new__(local_28._0_8_);
      std::unique_ptr<char[],std::default_delete<char[]>>::
      unique_ptr<char*,std::default_delete<char[]>,void,bool>
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)this_00,(char *)__p);
      std::unique_ptr<char[],_std::default_delete<char[]>_>::operator=
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)this_00,
                 (unique_ptr<char[],_std::default_delete<char[]>_> *)__p);
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)this_00);
    }
    if (local_28._0_8_ != 0) {
      std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)this_00);
    }
    deserialize_combined
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(ExtIsoForest *)this_01,
               imputer_00,(TreesIndexer *)this_00,(char *)__p);
    sVar3 = std::
            vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
            ::size(local_80);
    if ((sVar3 == 0) &&
       (sVar3 = std::
                vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                ::size(local_c8), sVar3 == 0)) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Error: model contains no trees.\n");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_170 = 3;
    local_171 = false;
    bVar1 = std::
            vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
            ::empty((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                     *)this_01);
    if (bVar1) {
      local_168 = std::
                  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ::size(local_c8);
    }
    else {
      local_168 = std::
                  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                  ::size(local_80);
      local_170 = 1;
    }
    bVar1 = std::
            vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            ::empty((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                     *)this_01);
    if (!bVar1) {
      sVar3 = std::
              vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
              ::size(avStack_110);
      if (sVar3 != local_168) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"Error: imputer has incorrect number of trees.\n");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_171 = true;
    }
    bVar1 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::empty
                      ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)this_01);
    if ((!bVar1) &&
       (sVar3 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::size(&local_150),
       sVar3 != local_168)) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Error: indexer has incorrect number of trees.\n");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __s = operator_new(0x1d8);
    memset(__s,0,0x1d8);
    isotree::IsolationForest::IsolationForest(this_00);
    std::unique_ptr<isotree::IsolationForest,std::default_delete<isotree::IsolationForest>>::
    unique_ptr<std::default_delete<isotree::IsolationForest>,void>
              ((unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                *)this_00,__p);
    pIVar4 = std::
             unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>::
             operator->((unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                         *)0x637b6a);
    pIVar4->nthreads = local_14;
    pIVar4 = std::
             unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>::
             operator->((unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                         *)0x637b8a);
    pIVar4->ndim = local_170;
    pIVar4 = std::
             unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>::
             operator->((unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                         *)0x637bad);
    pIVar4->ntrees = local_168;
    pIVar4 = std::
             unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>::
             operator->((unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                         *)0x637bce);
    pIVar4->build_imputer = local_171;
    bVar1 = std::
            vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
            ::empty((vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                     *)this_01);
    if (bVar1) {
      std::unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>::
      operator->((unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                  *)0x637c4f);
      isotree::IsolationForest::get_model_ext(this_01);
      ExtIsoForest::operator=((ExtIsoForest *)this_00,(ExtIsoForest *)__p);
    }
    else {
      std::unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>::
      operator->((unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                  *)0x637bf9);
      isotree::IsolationForest::get_model(this_01);
      IsoForest::operator=((IsoForest *)this_00,(IsoForest *)__p);
    }
    bVar1 = std::
            vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            ::empty((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                     *)this_01);
    if (!bVar1) {
      std::unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>::
      operator->((unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                  *)0x637c92);
      isotree::IsolationForest::get_imputer(this_01);
      Imputer::operator=((Imputer *)this_00,(Imputer *)__p);
    }
    bVar1 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::empty
                      ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)this_01);
    if (!bVar1) {
      std::unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>::
      operator->((unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                  *)0x637cd1);
      TreesIndexer::operator=((TreesIndexer *)this_00,(TreesIndexer *)__p);
    }
    local_8 = std::
              unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>::
              release((unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                       *)0x637cf5);
    std::unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>::
    ~unique_ptr((unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                 *)this_00);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)this_00);
    TreesIndexer::~TreesIndexer((TreesIndexer *)0x637d24);
    Imputer::~Imputer((Imputer *)this_00);
    ExtIsoForest::~ExtIsoForest((ExtIsoForest *)0x637d3e);
    IsoForest::~IsoForest((IsoForest *)0x637d4b);
  }
  return local_8;
}

Assistant:

ISOTREE_EXPORTED
void* isotree_deserialize_from_raw(const char *serialized_model, int nthreads)
{
    if (!serialized_model) {
        cerr << "Passed NULL 'serialized_model' to 'isotree_deserialize_from_raw'." << std::endl;
        return nullptr;
    }

    try
    {
        bool is_isotree_model = false;
        bool is_compatible = false;
        bool has_combined_objects = false;
        bool has_IsoForest = false;
        bool has_ExtIsoForest = false;
        bool has_Imputer = false;
        bool has_Indexer = false;
        bool has_metadata = false;
        size_t size_metadata = 0;
        inspect_serialized_object(
            serialized_model,
            is_isotree_model,
            is_compatible,
            has_combined_objects,
            has_IsoForest,
            has_ExtIsoForest,
            has_Imputer,
            has_Indexer,
            has_metadata,
            size_metadata
        );
        if (is_isotree_model && is_compatible && !has_combined_objects)
            throw std::runtime_error("Serialized model is not compatible.\n");

        IsoForest model = IsoForest();
        ExtIsoForest model_ext = ExtIsoForest();
        Imputer imputer = Imputer();
        TreesIndexer indexer = TreesIndexer();

        std::unique_ptr<char[]> buffer_metadata;
        if (size_metadata) {
            buffer_metadata = std::unique_ptr<char[]>(new char[size_metadata]);
        }

        deserialize_combined(
            serialized_model,
            &model,
            &model_ext,
            &imputer,
            &indexer,
            size_metadata? buffer_metadata.get() : (char*)nullptr
        );

        if (!model.trees.size() && !model_ext.hplanes.size())
            throw std::runtime_error("Error: model contains no trees.\n");

        size_t ntrees;
        size_t ndim = 3;
        bool build_imputer = false;

        if (!model.trees.empty()) {
            ntrees = model.trees.size();
            ndim = 1;
        }
        else {
            ntrees = model_ext.hplanes.size();
        }
        if (!imputer.imputer_tree.empty()) {
            if (imputer.imputer_tree.size() != ntrees)
                throw std::runtime_error("Error: imputer has incorrect number of trees.\n");
            build_imputer = true;
        }
        if (!indexer.indices.empty()) {
            if (indexer.indices.size() != ntrees)
                throw std::runtime_error("Error: indexer has incorrect number of trees.\n");
        }

        std::unique_ptr<IsolationForest> out(new IsolationForest());
        out->nthreads = nthreads;
        out->ndim = ndim;
        out->ntrees = ntrees;
        out->build_imputer = build_imputer;

        if (!model.trees.empty())
            out->get_model() = std::move(model);
        else
            out->get_model_ext() = std::move(model_ext);
        if (!imputer.imputer_tree.empty())
            out->get_imputer() = std::move(imputer);
        if (!indexer.indices.empty())
            out->indexer = std::move(indexer);

        return out.release();
    }

    catch (std::exception &e)
    {
        cerr << e.what();
        cerr.flush();
        return nullptr;
    }
}